

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# appender.cpp
# Opt level: O2

void __thiscall
duckdb::BaseAppender::AppendValueInternal<long,float>(BaseAppender *this,Vector *col,long input)

{
  float fVar1;
  
  fVar1 = Cast::Operation<long,float>(input);
  *(float *)(col->data + (this->chunk).count * 4) = fVar1;
  return;
}

Assistant:

void BaseAppender::AppendValueInternal(Vector &col, SRC input) {
	FlatVector::GetData<DST>(col)[chunk.size()] = Cast::Operation<SRC, DST>(input);
}